

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_from_signed62(secp256k1_scalar *r,secp256k1_modinv64_signed62 *a)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  int64_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  secp256k1_modinv64_signed62 *in_RCX;
  secp256k1_modinv64_signed62 *psVar9;
  long lVar10;
  ulong *extraout_RDX;
  long lVar11;
  long lVar12;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_00;
  long lVar13;
  long lVar14;
  secp256k1_modinv64_signed62 *b;
  secp256k1_modinv64_signed62 *psVar15;
  secp256k1_modinv64_signed62 *psVar16;
  long lVar17;
  int64_t *piVar18;
  int64_t *a_01;
  secp256k1_modinv64_signed62 *a_02;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  int64_t *piVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int64_t *piVar29;
  int64_t *a_03;
  bool bVar30;
  secp256k1_modinv64_signed62 sStack_128;
  secp256k1_modinv64_signed62 sStack_100;
  secp256k1_modinv64_signed62 *psStack_d8;
  int64_t *piStack_d0;
  int64_t *piStack_c8;
  ulong uStack_c0;
  int64_t *piStack_b8;
  ulong uStack_b0;
  int64_t *piStack_a8;
  secp256k1_modinv64_signed62 *psStack_a0;
  long lStack_98;
  int64_t *piStack_90;
  int64_t *piStack_88;
  secp256k1_modinv64_signed62 *psStack_80;
  long lStack_78;
  secp256k1_modinv64_signed62 *psStack_70;
  secp256k1_modinv64_signed62 *psStack_68;
  secp256k1_modinv64_signed62 *psStack_60;
  secp256k1_modinv64_signed62 *psStack_58;
  long lStack_50;
  int64_t *piStack_48;
  int64_t *piStack_40;
  
  piVar29 = a->v;
  if ((ulong)*piVar29 >> 0x3e == 0) {
    uVar6 = a->v[1];
    if (0x3fffffffffffffff < uVar6) goto LAB_001421fc;
    in_RCX = (secp256k1_modinv64_signed62 *)a->v[2];
    if ((secp256k1_modinv64_signed62 *)0x3fffffffffffffff < in_RCX) goto LAB_00142201;
    uVar7 = a->v[3];
    if (0x3fffffffffffffff < uVar7) goto LAB_00142206;
    a = (secp256k1_modinv64_signed62 *)a->v[4];
    if (a < &DAT_00000100) {
      r->d[0] = uVar6 << 0x3e | *piVar29;
      r->d[1] = (long)in_RCX << 0x3c | uVar6 >> 2;
      r->d[2] = uVar7 << 0x3a | (ulong)in_RCX >> 4;
      r->d[3] = (long)a << 0x38 | uVar7 >> 6;
      secp256k1_scalar_verify(r);
      return;
    }
  }
  else {
    secp256k1_scalar_from_signed62_cold_5();
LAB_001421fc:
    secp256k1_scalar_from_signed62_cold_4();
LAB_00142201:
    secp256k1_scalar_from_signed62_cold_3();
LAB_00142206:
    secp256k1_scalar_from_signed62_cold_2();
  }
  secp256k1_scalar_from_signed62_cold_1();
  lVar25 = *(long *)r;
  piStack_48 = *(int64_t **)((long)r + 8);
  psStack_58 = *(secp256k1_modinv64_signed62 **)((long)r + 0x10);
  lStack_78 = *(long *)((long)r + 0x18);
  psStack_68 = *(secp256k1_modinv64_signed62 **)((long)r + 0x20);
  piVar29 = *(int64_t **)a;
  piStack_40 = *(int64_t **)((long)a + 8);
  lStack_50 = *(long *)((long)a + 0x10);
  uStack_b0 = *extraout_RDX;
  piStack_a8 = (int64_t *)extraout_RDX[1];
  uStack_c0 = extraout_RDX[2];
  piStack_b8 = (int64_t *)extraout_RDX[3];
  psVar15 = *(secp256k1_modinv64_signed62 **)((long)a + 0x18);
  psStack_70 = *(secp256k1_modinv64_signed62 **)((long)a + 0x20);
  piVar18 = (int64_t *)0x5;
  psVar9 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  piStack_c8 = (int64_t *)0x1422ac;
  a_01 = (int64_t *)r;
  iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,-2);
  if (iVar2 < 1) {
    piStack_c8 = (int64_t *)0x142dcc;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_00142dcc:
    piStack_c8 = (int64_t *)0x142dd1;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_00142dd1:
    piStack_c8 = (int64_t *)0x142dd6;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_00142dd6:
    piStack_c8 = (int64_t *)0x142ddb;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_00142ddb:
    piStack_c8 = (int64_t *)0x142de0;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_00142de0:
    piStack_c8 = (int64_t *)0x142de5;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_00142de5:
    piStack_c8 = (int64_t *)0x142dea;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_00142dea:
    piStack_c8 = (int64_t *)0x142def;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar15 = in_RCX;
LAB_00142def:
    piStack_c8 = (int64_t *)0x142df4;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00142df4:
    piStack_c8 = (int64_t *)0x142df9;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_00142df9:
    piStack_c8 = (int64_t *)0x142dfe;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar16 = psVar15;
LAB_00142dfe:
    piStack_c8 = (int64_t *)0x142e03;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00142e03:
    piStack_c8 = (int64_t *)0x142e08;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00142e08:
    piStack_c8 = (int64_t *)0x142e0d;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_00142e0d:
    piStack_c8 = (int64_t *)0x142e12;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00142e12:
    piStack_c8 = (int64_t *)0x142e17;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00142e17:
    piStack_c8 = (int64_t *)0x142e1c;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_00142e1c:
    piStack_c8 = (int64_t *)0x142e21;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_00142e21:
    piStack_c8 = (int64_t *)0x142e26;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_00142e26:
    piStack_c8 = (int64_t *)0x142e2b;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_00142e2b:
    piStack_c8 = (int64_t *)0x142e30;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_00142e30:
    a_03 = piVar29;
    a = (secp256k1_modinv64_signed62 *)r;
    piStack_c8 = (int64_t *)0x142e35;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_00142e35:
    piStack_c8 = (int64_t *)0x142e3a;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_00142e3a:
    piStack_c8 = (int64_t *)0x142e3f;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_00142e3f:
    piStack_c8 = (int64_t *)0x142e44;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_00142e44:
    piStack_c8 = (int64_t *)0x142e49;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_00142e49:
    piStack_c8 = (int64_t *)0x142e4e;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_00142e4e:
    piStack_c8 = (int64_t *)0x142e53;
    secp256k1_modinv64_update_de_62_cold_23();
    r = (secp256k1_scalar *)a;
    piVar23 = a_03;
LAB_00142e53:
    piStack_c8 = (int64_t *)0x142e58;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_00142e58:
    piStack_c8 = (int64_t *)0x142e5d;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_00142e5d:
    piStack_c8 = (int64_t *)0x142e62;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_00142e62:
    psVar15 = psVar9;
    piStack_c8 = (int64_t *)0x142e67;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_00142e67:
    uVar3 = (uint)piVar18;
    piStack_c8 = (int64_t *)0x142e6c;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar9 = (secp256k1_modinv64_signed62 *)0x1;
    piVar18 = (int64_t *)0x5;
    piStack_c8 = (int64_t *)0x1422c9;
    a_01 = (int64_t *)r;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,1);
    if (-1 < iVar2) goto LAB_00142dcc;
    piVar18 = (int64_t *)0x5;
    psVar9 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    piStack_c8 = (int64_t *)0x1422e8;
    a_01 = a->v;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,-2);
    if (iVar2 < 1) goto LAB_00142dd1;
    psVar9 = (secp256k1_modinv64_signed62 *)0x1;
    piVar18 = (int64_t *)0x5;
    piStack_c8 = (int64_t *)0x142305;
    a_01 = a->v;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,1);
    if (-1 < iVar2) goto LAB_00142dd6;
    piStack_c8 = (int64_t *)0x14232b;
    piStack_88 = (int64_t *)r;
    psStack_60 = psVar15;
    iVar4 = secp256k1_modinv64_abs(uStack_b0);
    piStack_c8 = (int64_t *)0x142338;
    a_01 = piStack_a8;
    iVar5 = secp256k1_modinv64_abs((int64_t)piStack_a8);
    psVar9 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar5);
    r = (secp256k1_scalar *)(int64_t *)0x3fffffffffffffff;
    if ((long)psVar9 < iVar4) goto LAB_00142ddb;
    piStack_c8 = (int64_t *)0x142353;
    iVar4 = secp256k1_modinv64_abs(uStack_c0);
    piStack_c8 = (int64_t *)0x142360;
    a_01 = piStack_b8;
    iVar5 = secp256k1_modinv64_abs((int64_t)piStack_b8);
    a_03 = piStack_88;
    psVar9 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar5);
    if ((long)psVar9 < iVar4) goto LAB_00142de0;
    r = (secp256k1_scalar *)0x7fffffffffffffff;
    piVar18 = (int64_t *)(uStack_b0 * lVar25);
    psVar9 = SUB168(SEXT816((long)uStack_b0) * SEXT816(lVar25),8);
    uVar6 = (long)piStack_a8 * (long)piVar29;
    lVar11 = SUB168(SEXT816((long)piStack_a8) * SEXT816((long)piVar29),8);
    lVar10 = (0x7fffffffffffffff - lVar11) - (long)psVar9;
    if (-1 < lVar11 &&
        (SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar9) !=
        SBORROW8(lVar10,(ulong)((undefined1 *)~uVar6 < piVar18))) !=
        (long)(lVar10 - (ulong)((undefined1 *)~uVar6 < piVar18)) < 0) goto LAB_00142de5;
    piVar23 = (int64_t *)(uVar6 + (long)piVar18);
    lVar24 = (long)psVar9->v + (ulong)CARRY8(uVar6,(ulong)piVar18) + lVar11;
    uVar7 = uStack_c0 * lVar25;
    lVar11 = SUB168(SEXT816((long)uStack_c0) * SEXT816(lVar25),8);
    uVar8 = (long)piStack_b8 * (long)piVar29;
    lVar12 = SUB168(SEXT816((long)piStack_b8) * SEXT816((long)piVar29),8);
    uVar6 = (ulong)(-uVar8 - 1 < uVar7);
    lVar25 = (0x7fffffffffffffff - lVar12) - lVar11;
    lVar10 = lVar25 - uVar6;
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar12,lVar11) != SBORROW8(lVar25,uVar6)) == lVar10 < 0;
    psVar9 = (secp256k1_modinv64_signed62 *)
             CONCAT71((int7)((ulong)lVar10 >> 8),lVar12 < 0 || bVar30);
    if (lVar12 >= 0 && !bVar30) goto LAB_00142dea;
    psVar15 = (secp256k1_modinv64_signed62 *)((long)psStack_70 >> 0x3f);
    lStack_98 = ((ulong)piStack_a8 & (ulong)psVar15) + (uStack_b0 & (long)psStack_68 >> 0x3f);
    uVar19 = uVar8 + uVar7;
    a_01 = (int64_t *)(lVar12 + lVar11 + (ulong)CARRY8(uVar8,uVar7));
    lVar25 = in_RCX->v[0];
    piVar18 = (int64_t *)in_RCX[1].v[0];
    psVar9 = (secp256k1_modinv64_signed62 *)0x3fffffffffffffff;
    lStack_98 = lStack_98 - ((long)piVar18 * (long)piVar23 + lStack_98 & 0x3fffffffffffffffU);
    uVar7 = lStack_98 * lVar25;
    lVar11 = SUB168(SEXT816(lStack_98) * SEXT816(lVar25),8);
    uVar6 = (ulong)((undefined1 *)(-uVar7 - 1) < piVar23);
    lVar10 = (0x7fffffffffffffff - lVar11) - lVar24;
    piVar29 = (int64_t *)((-0x8000000000000000 - lVar11) - (ulong)(uVar7 != 0));
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar24) != SBORROW8(lVar10,uVar6)) ==
             (long)(lVar10 - uVar6) < 0;
    if (lVar11 < 0) {
      bVar30 = (SBORROW8(lVar24,(long)piVar29) !=
               SBORROW8(lVar24 - (long)piVar29,(ulong)(piVar23 < (undefined1 *)-uVar7))) ==
               (long)((lVar24 - (long)piVar29) - (ulong)(piVar23 < (undefined1 *)-uVar7)) < 0;
    }
    piStack_90 = a->v;
    psStack_80 = in_RCX;
    if (!bVar30) goto LAB_00142def;
    lVar10 = ((ulong)psVar15 & (ulong)piStack_b8) + ((long)psStack_68 >> 0x3f & uStack_c0);
    psVar15 = (secp256k1_modinv64_signed62 *)
              (lVar10 - ((long)piVar18 * uVar19 + lVar10 & 0x3fffffffffffffff));
    lVar11 = lVar11 + lVar24 + (ulong)CARRY8(uVar7,(ulong)piVar23);
    uVar8 = (long)psVar15 * lVar25;
    lVar10 = SUB168(SEXT816((long)psVar15) * SEXT816(lVar25),8);
    uVar6 = (ulong)(-uVar8 - 1 < uVar19);
    lVar25 = (0x7fffffffffffffff - lVar10) - (long)a_01;
    piVar18 = (int64_t *)((-0x8000000000000000 - lVar10) - (ulong)(uVar8 != 0));
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar10,(long)a_01) != SBORROW8(lVar25,uVar6)) ==
             (long)(lVar25 - uVar6) < 0;
    if (lVar10 < 0) {
      bVar30 = (SBORROW8((long)a_01,(long)piVar18) !=
               SBORROW8((long)a_01 - (long)piVar18,(ulong)(uVar19 < -uVar8))) ==
               (long)(((long)a_01 - (long)piVar18) - (ulong)(uVar19 < -uVar8)) < 0;
    }
    if (!bVar30) goto LAB_00142df4;
    lVar25 = (long)a_01 + (ulong)CARRY8(uVar8,uVar19) + lVar10;
    if ((uVar7 + (long)piVar23 & 0x3fffffffffffffff) != 0) goto LAB_00142df9;
    psVar16 = psVar15;
    if ((uVar8 + uVar19 & 0x3fffffffffffffff) != 0) goto LAB_00142dfe;
    psVar16 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar6 = (ulong)(uVar7 + (long)piVar23) >> 0x3e | lVar11 * 4;
    psVar9 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar22 = uStack_b0 * (long)piStack_48 + uVar6;
    a_01 = (int64_t *)
           (SUB168(SEXT816((long)uStack_b0) * SEXT816((long)piStack_48),8) + (lVar11 >> 0x3e) +
           (ulong)CARRY8(uStack_b0 * (long)piStack_48,uVar6));
    uVar7 = (long)piStack_a8 * (long)piStack_40;
    lVar12 = SUB168(SEXT816((long)piStack_a8) * SEXT816((long)piStack_40),8);
    uVar6 = (ulong)(-uVar7 - 1 < uVar22);
    lVar10 = (0x7fffffffffffffff - lVar12) - (long)a_01;
    lVar24 = (-0x8000000000000000 - lVar12) - (ulong)(uVar7 != 0);
    lVar11 = (long)a_01 - lVar24;
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar12,(long)a_01) != SBORROW8(lVar10,uVar6)) ==
             (long)(lVar10 - uVar6) < 0;
    if (lVar12 < 0) {
      bVar30 = (SBORROW8((long)a_01,lVar24) != SBORROW8(lVar11,(ulong)(uVar22 < -uVar7))) ==
               (long)(lVar11 - (ulong)(uVar22 < -uVar7)) < 0;
    }
    piVar18 = (int64_t *)(ulong)bVar30;
    r = (secp256k1_scalar *)piStack_48;
    piVar29 = piStack_40;
    psStack_a0 = psVar15;
    if (bVar30 == false) goto LAB_00142e03;
    uVar6 = uVar8 + uVar19 >> 0x3e | lVar25 * 4;
    uVar8 = uVar22 + uVar7;
    a_01 = (int64_t *)((long)a_01 + (ulong)CARRY8(uVar22,uVar7) + lVar12);
    uVar19 = uStack_c0 * (long)piStack_48 + uVar6;
    lVar12 = SUB168(SEXT816((long)uStack_c0) * SEXT816((long)piStack_48),8) + (lVar25 >> 0x3e) +
             (ulong)CARRY8(uStack_c0 * (long)piStack_48,uVar6);
    uVar7 = (long)piStack_b8 * (long)piStack_40;
    lVar11 = SUB168(SEXT816((long)piStack_b8) * SEXT816((long)piStack_40),8);
    uVar6 = (ulong)(-uVar7 - 1 < uVar19);
    lVar25 = (0x7fffffffffffffff - lVar11) - lVar12;
    lVar24 = (-0x8000000000000000 - lVar11) - (ulong)(uVar7 != 0);
    lVar10 = lVar12 - lVar24;
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar12) != SBORROW8(lVar25,uVar6)) ==
             (long)(lVar25 - uVar6) < 0;
    if (lVar11 < 0) {
      bVar30 = (SBORROW8(lVar12,lVar24) != SBORROW8(lVar10,(ulong)(uVar19 < -uVar7))) ==
               (long)(lVar10 - (ulong)(uVar19 < -uVar7)) < 0;
    }
    piVar18 = (int64_t *)(ulong)bVar30;
    if (bVar30 == false) goto LAB_00142e08;
    r = (secp256k1_scalar *)0x7fffffffffffffff;
    uVar6 = uVar19 + uVar7;
    lVar10 = lVar12 + lVar11 + (ulong)CARRY8(uVar19,uVar7);
    lVar25 = in_RCX->v[1];
    if (lVar25 != 0) {
      uVar19 = lVar25 * lStack_98;
      lVar12 = SUB168(SEXT816(lVar25) * SEXT816(lStack_98),8);
      uVar7 = (ulong)(-uVar19 - 1 < uVar8);
      lVar11 = (0x7fffffffffffffff - lVar12) - (long)a_01;
      piVar18 = (int64_t *)((-0x8000000000000000 - lVar12) - (ulong)(uVar19 != 0));
      bVar30 = (SBORROW8(0x7fffffffffffffff - lVar12,(long)a_01) != SBORROW8(lVar11,uVar7)) ==
               (long)(lVar11 - uVar7) < 0;
      if (lVar12 < 0) {
        bVar30 = (SBORROW8((long)a_01,(long)piVar18) !=
                 SBORROW8((long)a_01 - (long)piVar18,(ulong)(uVar8 < -uVar19))) ==
                 (long)(((long)a_01 - (long)piVar18) - (ulong)(uVar8 < -uVar19)) < 0;
      }
      psVar9 = psVar15;
      piVar23 = piStack_40;
      if (!bVar30) goto LAB_00142e53;
      uVar22 = lVar25 * (long)psVar15;
      lVar24 = SUB168(SEXT816(lVar25) * SEXT816((long)psVar15),8);
      uVar7 = (ulong)(-uVar22 - 1 < uVar6);
      lVar25 = (0x7fffffffffffffff - lVar24) - lVar10;
      lVar28 = (-0x8000000000000000 - lVar24) - (ulong)(uVar22 != 0);
      lVar11 = lVar10 - lVar28;
      piVar23 = (int64_t *)(lVar11 - (ulong)(uVar6 < -uVar22));
      bVar30 = (SBORROW8(0x7fffffffffffffff - lVar24,lVar10) != SBORROW8(lVar25,uVar7)) ==
               (long)(lVar25 - uVar7) < 0;
      if (lVar24 < 0) {
        bVar30 = (SBORROW8(lVar10,lVar28) != SBORROW8(lVar11,(ulong)(uVar6 < -uVar22))) ==
                 (long)piVar23 < 0;
      }
      piVar18 = (int64_t *)(ulong)bVar30;
      if (bVar30 != false) {
        bVar30 = CARRY8(uVar8,uVar19);
        uVar8 = uVar8 + uVar19;
        a_01 = (int64_t *)((long)a_01 + (ulong)bVar30 + lVar12);
        bVar30 = CARRY8(uVar6,uVar22);
        uVar6 = uVar6 + uVar22;
        lVar10 = lVar10 + lVar24 + (ulong)bVar30;
        goto LAB_00142727;
      }
      goto LAB_00142e58;
    }
LAB_00142727:
    uVar7 = (long)a_01 << 2 | uVar8 >> 0x3e;
    uVar22 = uStack_b0 * (long)psStack_58 + uVar7;
    a_01 = (int64_t *)
           (((long)a_01 >> 0x3e) + SUB168(SEXT816((long)uStack_b0) * SEXT816((long)psStack_58),8) +
           (ulong)CARRY8(uStack_b0 * (long)psStack_58,uVar7));
    uVar19 = (long)piStack_a8 * lStack_50;
    lVar12 = SUB168(SEXT816((long)piStack_a8) * SEXT816(lStack_50),8);
    uVar7 = (ulong)(-uVar19 - 1 < uVar22);
    lVar25 = (0x7fffffffffffffff - lVar12) - (long)a_01;
    lVar24 = (-0x8000000000000000 - lVar12) - (ulong)(uVar19 != 0);
    lVar11 = (long)a_01 - lVar24;
    *piStack_88 = uVar8 & 0x3fffffffffffffff;
    *(ulong *)a = uVar6 & 0x3fffffffffffffff;
    bVar30 = (SBORROW8((long)a_01,lVar24) != SBORROW8(lVar11,(ulong)(uVar22 < -uVar19))) ==
             (long)(lVar11 - (ulong)(uVar22 < -uVar19)) < 0;
    piVar18 = (int64_t *)(ulong)bVar30;
    bVar1 = (SBORROW8(0x7fffffffffffffff - lVar12,(long)a_01) != SBORROW8(lVar25,uVar7)) ==
            (long)(lVar25 - uVar7) < 0;
    if (lVar12 < 0) {
      bVar1 = bVar30;
    }
    psVar9 = psStack_58;
    piVar29 = piStack_88;
    if (!bVar1) goto LAB_00142e0d;
    uVar6 = uVar6 >> 0x3e | lVar10 << 2;
    uVar20 = uVar22 + uVar19;
    a_01 = (int64_t *)((long)a_01 + (ulong)CARRY8(uVar22,uVar19) + lVar12);
    uVar8 = uStack_c0 * (long)psStack_58 + uVar6;
    lVar11 = SUB168(SEXT816((long)uStack_c0) * SEXT816((long)psStack_58),8) + (lVar10 >> 0x3e) +
             (ulong)CARRY8(uStack_c0 * (long)psStack_58,uVar6);
    uVar7 = (long)piStack_b8 * lStack_50;
    lVar10 = SUB168(SEXT816((long)piStack_b8) * SEXT816(lStack_50),8);
    uVar6 = (ulong)(-uVar7 - 1 < uVar8);
    lVar25 = (0x7fffffffffffffff - lVar10) - lVar11;
    psVar9 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    psVar16 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar10) - (ulong)(uVar7 != 0));
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar10,lVar11) != SBORROW8(lVar25,uVar6)) ==
             (long)(lVar25 - uVar6) < 0;
    if (lVar10 < 0) {
      bVar30 = (SBORROW8(lVar11,(long)psVar16) !=
               SBORROW8(lVar11 - (long)psVar16,(ulong)(uVar8 < -uVar7))) ==
               (long)((lVar11 - (long)psVar16) - (ulong)(uVar8 < -uVar7)) < 0;
    }
    piVar18 = (int64_t *)(ulong)bVar30;
    if (bVar30 == false) goto LAB_00142e12;
    uVar6 = uVar8 + uVar7;
    lVar10 = lVar11 + lVar10 + (ulong)CARRY8(uVar8,uVar7);
    lVar25 = in_RCX->v[2];
    if (lVar25 != 0) {
      uVar8 = lVar25 * lStack_98;
      lVar12 = SUB168(SEXT816(lVar25) * SEXT816(lStack_98),8);
      uVar7 = (ulong)(-uVar8 - 1 < uVar20);
      lVar11 = (0x7fffffffffffffff - lVar12) - (long)a_01;
      piVar18 = (int64_t *)((-0x8000000000000000 - lVar12) - (ulong)(uVar8 != 0));
      bVar30 = (SBORROW8(0x7fffffffffffffff - lVar12,(long)a_01) != SBORROW8(lVar11,uVar7)) ==
               (long)(lVar11 - uVar7) < 0;
      if (lVar12 < 0) {
        bVar30 = (SBORROW8((long)a_01,(long)piVar18) !=
                 SBORROW8((long)a_01 - (long)piVar18,(ulong)(uVar20 < -uVar8))) ==
                 (long)(((long)a_01 - (long)piVar18) - (ulong)(uVar20 < -uVar8)) < 0;
      }
      piVar23 = piStack_88;
      if (!bVar30) goto LAB_00142e5d;
      uVar19 = lVar25 * (long)psVar15;
      lVar24 = SUB168(SEXT816(lVar25) * SEXT816((long)psVar15),8);
      uVar7 = (ulong)(-uVar19 - 1 < uVar6);
      lVar25 = (0x7fffffffffffffff - lVar24) - lVar10;
      lVar28 = (-0x8000000000000000 - lVar24) - (ulong)(uVar19 != 0);
      lVar11 = lVar10 - lVar28;
      piVar23 = (int64_t *)
                (ulong)((SBORROW8(lVar10,lVar28) != SBORROW8(lVar11,(ulong)(uVar6 < -uVar19))) ==
                       (long)(lVar11 - (ulong)(uVar6 < -uVar19)) < 0);
      piVar18 = (int64_t *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar24,lVar10) != SBORROW8(lVar25,uVar7)) ==
                       (long)(lVar25 - uVar7) < 0);
      if (lVar24 < 0) {
        piVar18 = piVar23;
      }
      if ((char)piVar18 != '\0') {
        bVar30 = CARRY8(uVar20,uVar8);
        uVar20 = uVar20 + uVar8;
        a_01 = (int64_t *)((long)a_01 + (ulong)bVar30 + lVar12);
        bVar30 = CARRY8(uVar6,uVar19);
        uVar6 = uVar6 + uVar19;
        lVar10 = lVar10 + lVar24 + (ulong)bVar30;
        goto LAB_00142921;
      }
      goto LAB_00142e62;
    }
LAB_00142921:
    r = (secp256k1_scalar *)0x8000000000000000;
    psVar16 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar7 = (long)a_01 << 2 | uVar20 >> 0x3e;
    uVar19 = uStack_b0 * lStack_78 + uVar7;
    a_01 = (int64_t *)
           (((long)a_01 >> 0x3e) + SUB168(SEXT816((long)uStack_b0) * SEXT816(lStack_78),8) +
           (ulong)CARRY8(uStack_b0 * lStack_78,uVar7));
    uVar8 = (long)piStack_a8 * (long)psStack_60;
    lVar12 = SUB168(SEXT816((long)piStack_a8) * SEXT816((long)psStack_60),8);
    uVar7 = (ulong)(-uVar8 - 1 < uVar19);
    lVar25 = (0x7fffffffffffffff - lVar12) - (long)a_01;
    lVar24 = (-0x8000000000000000 - lVar12) - (ulong)(uVar8 != 0);
    lVar11 = (long)a_01 - lVar24;
    piStack_88[1] = uVar20 & 0x3fffffffffffffff;
    *(ulong *)((long)a + 8) = uVar6 & 0x3fffffffffffffff;
    bVar30 = (SBORROW8((long)a_01,lVar24) != SBORROW8(lVar11,(ulong)(uVar19 < -uVar8))) ==
             (long)(lVar11 - (ulong)(uVar19 < -uVar8)) < 0;
    piVar18 = (int64_t *)(ulong)bVar30;
    bVar1 = (SBORROW8(0x7fffffffffffffff - lVar12,(long)a_01) != SBORROW8(lVar25,uVar7)) ==
            (long)(lVar25 - uVar7) < 0;
    if (lVar12 < 0) {
      bVar1 = bVar30;
    }
    psVar9 = psStack_60;
    if (!bVar1) goto LAB_00142e17;
    uVar6 = uVar6 >> 0x3e | lVar10 << 2;
    uVar22 = uVar19 + uVar8;
    a_01 = (int64_t *)((long)a_01 + (ulong)CARRY8(uVar19,uVar8) + lVar12);
    uVar8 = uStack_c0 * lStack_78 + uVar6;
    lVar11 = SUB168(SEXT816((long)uStack_c0) * SEXT816(lStack_78),8) + (lVar10 >> 0x3e) +
             (ulong)CARRY8(uStack_c0 * lStack_78,uVar6);
    uVar7 = (long)piStack_b8 * (long)psStack_60;
    lVar10 = SUB168(SEXT816((long)piStack_b8) * SEXT816((long)psStack_60),8);
    uVar6 = (ulong)(-uVar7 - 1 < uVar8);
    lVar25 = (0x7fffffffffffffff - lVar10) - lVar11;
    psVar16 = (secp256k1_modinv64_signed62 *)(lVar25 - uVar6);
    psVar9 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    r = (secp256k1_scalar *)((-0x8000000000000000 - lVar10) - (ulong)(uVar7 != 0));
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar10,lVar11) != SBORROW8(lVar25,uVar6)) ==
             (long)psVar16 < 0;
    if (lVar10 < 0) {
      bVar30 = (SBORROW8(lVar11,(long)r) != SBORROW8(lVar11 - (long)r,(ulong)(uVar8 < -uVar7))) ==
               (long)((lVar11 - (long)r) - (ulong)(uVar8 < -uVar7)) < 0;
    }
    piVar18 = (int64_t *)(ulong)bVar30;
    if (bVar30 == false) goto LAB_00142e1c;
    uVar6 = uVar8 + uVar7;
    lVar10 = lVar11 + lVar10 + (ulong)CARRY8(uVar8,uVar7);
    lVar25 = in_RCX->v[3];
    if (lVar25 == 0) {
LAB_00142b04:
      r = (secp256k1_scalar *)0x8000000000000000;
      uVar7 = (long)a_01 << 2 | uVar22 >> 0x3e;
      uVar19 = uStack_b0 * (long)psStack_68 + uVar7;
      a_01 = (int64_t *)
             (((long)a_01 >> 0x3e) + SUB168(SEXT816((long)uStack_b0) * SEXT816((long)psStack_68),8)
             + (ulong)CARRY8(uStack_b0 * (long)psStack_68,uVar7));
      uVar8 = (long)piStack_a8 * (long)psStack_70;
      lVar12 = SUB168(SEXT816((long)piStack_a8) * SEXT816((long)psStack_70),8);
      uVar7 = (ulong)(-uVar8 - 1 < uVar19);
      lVar25 = (0x7fffffffffffffff - lVar12) - (long)a_01;
      lVar24 = (-0x8000000000000000 - lVar12) - (ulong)(uVar8 != 0);
      lVar11 = (long)a_01 - lVar24;
      piStack_88[2] = uVar22 & 0x3fffffffffffffff;
      *(ulong *)((long)a + 0x10) = uVar6 & 0x3fffffffffffffff;
      bVar30 = (SBORROW8((long)a_01,lVar24) != SBORROW8(lVar11,(ulong)(uVar19 < -uVar8))) ==
               (long)(lVar11 - (ulong)(uVar19 < -uVar8)) < 0;
      piVar18 = (int64_t *)(ulong)bVar30;
      bVar1 = (SBORROW8(0x7fffffffffffffff - lVar12,(long)a_01) != SBORROW8(lVar25,uVar7)) ==
              (long)(lVar25 - uVar7) < 0;
      if (lVar12 < 0) {
        bVar1 = bVar30;
      }
      psVar9 = psStack_70;
      psVar16 = psStack_68;
      if (!bVar1) goto LAB_00142e21;
      uVar6 = uVar6 >> 0x3e | lVar10 << 2;
      uVar22 = uVar19 + uVar8;
      a_01 = (int64_t *)((long)a_01 + (ulong)CARRY8(uVar19,uVar8) + lVar12);
      uVar8 = uStack_c0 * (long)psStack_68 + uVar6;
      lVar12 = SUB168(SEXT816((long)uStack_c0) * SEXT816((long)psStack_68),8) + (lVar10 >> 0x3e) +
               (ulong)CARRY8(uStack_c0 * (long)psStack_68,uVar6);
      uVar7 = (long)piStack_b8 * (long)psStack_70;
      lVar11 = SUB168(SEXT816((long)piStack_b8) * SEXT816((long)psStack_70),8);
      uVar6 = (ulong)(-uVar7 - 1 < uVar8);
      lVar25 = (0x7fffffffffffffff - lVar11) - lVar12;
      lVar24 = (-0x8000000000000000 - lVar11) - (ulong)(uVar7 != 0);
      lVar10 = lVar12 - lVar24;
      bVar30 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar12) != SBORROW8(lVar25,uVar6)) ==
               (long)(lVar25 - uVar6) < 0;
      if (lVar11 < 0) {
        bVar30 = (SBORROW8(lVar12,lVar24) != SBORROW8(lVar10,(ulong)(uVar8 < -uVar7))) ==
                 (long)(lVar10 - (ulong)(uVar8 < -uVar7)) < 0;
      }
      piVar18 = (int64_t *)(ulong)bVar30;
      if (bVar30 == false) goto LAB_00142e26;
      uVar19 = uVar8 + uVar7;
      lVar11 = lVar12 + lVar11 + (ulong)CARRY8(uVar8,uVar7);
      lVar25 = in_RCX->v[4];
      uVar7 = lVar25 * lStack_98;
      piVar18 = SUB168(SEXT816(lVar25) * SEXT816(lStack_98),8);
      uVar6 = (ulong)(-uVar7 - 1 < uVar22);
      lVar10 = (0x7fffffffffffffff - (long)piVar18) - (long)a_01;
      piVar29 = (int64_t *)((-0x8000000000000000 - (long)piVar18) - (ulong)(uVar7 != 0));
      bVar30 = (SBORROW8(0x7fffffffffffffff - (long)piVar18,(long)a_01) != SBORROW8(lVar10,uVar6))
               == (long)(lVar10 - uVar6) < 0;
      if ((long)piVar18 < 0) {
        bVar30 = (SBORROW8((long)a_01,(long)piVar29) !=
                 SBORROW8((long)a_01 - (long)piVar29,(ulong)(uVar22 < -uVar7))) ==
                 (long)(((long)a_01 - (long)piVar29) - (ulong)(uVar22 < -uVar7)) < 0;
      }
      if (!bVar30) goto LAB_00142e2b;
      uVar8 = lVar25 * (long)psVar15;
      lVar10 = SUB168(SEXT816(lVar25) * SEXT816((long)psVar15),8);
      psVar16 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
      uVar6 = (ulong)(-uVar8 - 1 < uVar19);
      lVar25 = (0x7fffffffffffffff - lVar10) - lVar11;
      r = (secp256k1_scalar *)((-0x8000000000000000 - lVar10) - (ulong)(uVar8 != 0));
      bVar30 = (SBORROW8(0x7fffffffffffffff - lVar10,lVar11) != SBORROW8(lVar25,uVar6)) ==
               (long)(lVar25 - uVar6) < 0;
      if (lVar10 < 0) {
        bVar30 = (SBORROW8(lVar11,(long)r) != SBORROW8(lVar11 - (long)r,(ulong)(uVar19 < -uVar8)))
                 == (long)((lVar11 - (long)r) - (ulong)(uVar19 < -uVar8)) < 0;
      }
      psVar9 = (secp256k1_modinv64_signed62 *)(ulong)bVar30;
      if (bVar30 == false) goto LAB_00142e30;
      lVar12 = (long)piVar18 + (long)a_01 + (ulong)CARRY8(uVar7,uVar22);
      lVar25 = lVar10 + lVar11 + (ulong)CARRY8(uVar8,uVar19);
      psVar9 = (secp256k1_modinv64_signed62 *)(lVar12 * 4 | uVar7 + uVar22 >> 0x3e);
      piStack_88[3] = uVar7 + uVar22 & 0x3fffffffffffffff;
      *(ulong *)((long)a + 0x18) = uVar8 + uVar19 & 0x3fffffffffffffff;
      a_01 = psVar9[0x333333333333332].v + 4;
      piVar18 = (int64_t *)
                ((lVar12 >> 0x3e) + -1 +
                (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar9));
      if (piVar18 != (int64_t *)0xffffffffffffffff) goto LAB_00142e35;
      piVar18 = (int64_t *)0xffffffffffffffff;
      uVar6 = uVar8 + uVar19 >> 0x3e | lVar25 * 4;
      piStack_88[4] = (int64_t)psVar9;
      psVar16 = (secp256k1_modinv64_signed62 *)(uVar6 + 0x8000000000000000);
      if ((lVar25 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar6) != -1) goto LAB_00142e3a;
      *(ulong *)((long)a + 0x20) = uVar6;
      piVar18 = (int64_t *)0x5;
      psVar9 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
      piStack_c8 = (int64_t *)0x142d54;
      a_01 = piStack_88;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piStack_88,5,in_RCX,-2);
      if (iVar2 < 1) goto LAB_00142e3f;
      psVar9 = (secp256k1_modinv64_signed62 *)0x1;
      piVar18 = (int64_t *)0x5;
      piStack_c8 = (int64_t *)0x142d71;
      a_01 = a_03;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_03,5,in_RCX,1);
      if (-1 < iVar2) goto LAB_00142e44;
      piVar18 = (int64_t *)0x5;
      psVar9 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
      piStack_c8 = (int64_t *)0x142d90;
      a_01 = a->v;
      iVar2 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,-2);
      if (iVar2 < 1) goto LAB_00142e49;
      psVar9 = (secp256k1_modinv64_signed62 *)0x1;
      piVar18 = (int64_t *)0x5;
      piStack_c8 = (int64_t *)0x142dad;
      a_01 = a->v;
      iVar2 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_00142e4e;
    }
    psVar16 = (secp256k1_modinv64_signed62 *)(lVar25 * lStack_98);
    lVar12 = SUB168(SEXT816(lVar25) * SEXT816(lStack_98),8);
    uVar7 = (ulong)(-(long)psVar16 - 1U < uVar22);
    lVar11 = (0x7fffffffffffffff - lVar12) - (long)a_01;
    r = (secp256k1_scalar *)0x8000000000000000;
    piVar18 = (int64_t *)
              ((-0x8000000000000000 - lVar12) -
              (ulong)(psVar16 != (secp256k1_modinv64_signed62 *)0x0));
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar12,(long)a_01) != SBORROW8(lVar11,uVar7)) ==
             (long)(lVar11 - uVar7) < 0;
    if (lVar12 < 0) {
      bVar30 = (SBORROW8((long)a_01,(long)piVar18) !=
               SBORROW8((long)a_01 - (long)piVar18,(ulong)(uVar22 < (ulong)-(long)psVar16))) ==
               (long)(((long)a_01 - (long)piVar18) - (ulong)(uVar22 < (ulong)-(long)psVar16)) < 0;
    }
    piVar23 = piStack_88;
    if (!bVar30) goto LAB_00142e67;
    uVar8 = lVar25 * (long)psVar15;
    lVar24 = SUB168(SEXT816(lVar25) * SEXT816((long)psVar15),8);
    uVar7 = (ulong)(-uVar8 - 1 < uVar6);
    lVar25 = (0x7fffffffffffffff - lVar24) - lVar10;
    lVar28 = (-0x8000000000000000 - lVar24) - (ulong)(uVar8 != 0);
    lVar11 = lVar10 - lVar28;
    piVar23 = (int64_t *)(lVar11 - (ulong)(uVar6 < -uVar8));
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar24,lVar10) != SBORROW8(lVar25,uVar7)) ==
             (long)(lVar25 - uVar7) < 0;
    if (lVar24 < 0) {
      bVar30 = (SBORROW8(lVar10,lVar28) != SBORROW8(lVar11,(ulong)(uVar6 < -uVar8))) ==
               (long)piVar23 < 0;
    }
    uVar3 = (uint)bVar30;
    if (bVar30 != false) {
      bVar30 = CARRY8(uVar22,(ulong)psVar16);
      uVar22 = (long)psVar16->v + uVar22;
      a_01 = (int64_t *)((long)a_01 + (ulong)bVar30 + lVar12);
      bVar30 = CARRY8(uVar6,uVar8);
      uVar6 = uVar6 + uVar8;
      lVar10 = lVar10 + lVar24 + (ulong)bVar30;
      goto LAB_00142b04;
    }
  }
  piStack_c8 = (int64_t *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  a_02 = &sStack_128;
  psStack_d8 = psVar16;
  piStack_d0 = (int64_t *)r;
  piStack_c8 = piVar23;
  secp256k1_modinv64_mul_62(&sStack_100,(secp256k1_modinv64_signed62 *)a_01,uVar3,1);
  psVar9 = a_00;
  secp256k1_modinv64_mul_62(&sStack_128,a_00,5,(int64_t)psVar15);
  lVar25 = 0;
  while ((ulong)sStack_100.v[lVar25] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_128.v[lVar25]) goto LAB_00142f01;
    lVar25 = lVar25 + 1;
    if (lVar25 == 4) {
      uVar3 = 4;
      while( true ) {
        if (sStack_100.v[uVar3] < sStack_128.v[uVar3]) {
          return;
        }
        if (sStack_128.v[uVar3] < sStack_100.v[uVar3]) break;
        bVar30 = uVar3 == 0;
        uVar3 = uVar3 - 1;
        if (bVar30) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00142f01:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar2 = (int)a_02;
  if (iVar2 < 1) {
LAB_001431c0:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_001431c5:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_001431ca:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_001431cf:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_001431d4:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_001431d9:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar25 = psVar15->v[0];
    lVar10 = psVar15->v[1];
    lVar11 = psVar9->v[0];
    lVar12 = *extraout_RDX_00;
    uVar6 = lVar11 * lVar25;
    lVar28 = SUB168(SEXT816(lVar11) * SEXT816(lVar25),8);
    uVar7 = lVar12 * lVar10;
    lVar13 = SUB168(SEXT816(lVar12) * SEXT816(lVar10),8);
    lVar24 = (0x7fffffffffffffff - lVar13) - lVar28;
    if (-1 < lVar13 &&
        (SBORROW8(0x7fffffffffffffff - lVar13,lVar28) != SBORROW8(lVar24,(ulong)(~uVar7 < uVar6)))
        != (long)(lVar24 - (ulong)(~uVar7 < uVar6)) < 0) goto LAB_001431c5;
    lVar24 = psVar15->v[2];
    lVar21 = lVar13 + lVar28 + (ulong)CARRY8(uVar7,uVar6);
    lVar28 = psVar15->v[3];
    uVar19 = lVar11 * lVar24;
    lVar13 = SUB168(SEXT816(lVar11) * SEXT816(lVar24),8);
    uVar22 = lVar12 * lVar28;
    lVar12 = SUB168(SEXT816(lVar12) * SEXT816(lVar28),8);
    uVar8 = (ulong)(-uVar22 - 1 < uVar19);
    lVar11 = (0x7fffffffffffffff - lVar12) - lVar13;
    if (-1 < lVar12 &&
        (SBORROW8(0x7fffffffffffffff - lVar12,lVar13) != SBORROW8(lVar11,uVar8)) !=
        (long)(lVar11 - uVar8) < 0) goto LAB_001431ca;
    lVar11 = lVar12 + lVar13 + (ulong)CARRY8(uVar22,uVar19);
    if ((uVar7 + uVar6 & 0x3fffffffffffffff) != 0) goto LAB_001431cf;
    if ((uVar22 + uVar19 & 0x3fffffffffffffff) != 0) goto LAB_001431d4;
    uVar8 = uVar22 + uVar19 >> 0x3e | lVar11 * 4;
    uVar6 = uVar7 + uVar6 >> 0x3e | lVar21 * 4;
    lVar11 = lVar11 >> 0x3e;
    lVar21 = lVar21 >> 0x3e;
    if (iVar2 != 1) {
      psVar15 = (secp256k1_modinv64_signed62 *)((ulong)a_02 & 0xffffffff);
      a_02 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar12 = psVar9->v[(long)a_02];
        uVar19 = lVar12 * lVar25 + uVar6;
        lVar17 = SUB168(SEXT816(lVar12) * SEXT816(lVar25),8) + lVar21 +
                 (ulong)CARRY8(lVar12 * lVar25,uVar6);
        lVar13 = extraout_RDX_00[(long)a_02];
        uVar7 = lVar13 * lVar10;
        lVar14 = SUB168(SEXT816(lVar13) * SEXT816(lVar10),8);
        uVar6 = (ulong)(-uVar7 - 1 < uVar19);
        lVar21 = (0x7fffffffffffffff - lVar14) - lVar17;
        psVar16 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar26 = (-0x8000000000000000 - lVar14) - (ulong)(uVar7 != 0);
        lVar27 = lVar17 - lVar26;
        bVar30 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar17) != SBORROW8(lVar21,uVar6)) ==
                 (long)(lVar21 - uVar6) < 0;
        if (lVar14 < 0) {
          bVar30 = (SBORROW8(lVar17,lVar26) != SBORROW8(lVar27,(ulong)(uVar19 < -uVar7))) ==
                   (long)(lVar27 - (ulong)(uVar19 < -uVar7)) < 0;
        }
        if (!bVar30) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_001431bb:
          psVar9 = psVar16;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_001431c0;
        }
        uVar20 = lVar12 * lVar24 + uVar8;
        lVar27 = SUB168(SEXT816(lVar12) * SEXT816(lVar24),8) + lVar11 +
                 (ulong)CARRY8(lVar12 * lVar24,uVar8);
        uVar22 = lVar13 * lVar28;
        lVar13 = SUB168(SEXT816(lVar13) * SEXT816(lVar28),8);
        uVar6 = (ulong)(-uVar22 - 1 < uVar20);
        lVar11 = (0x7fffffffffffffff - lVar13) - lVar27;
        lVar21 = (-0x8000000000000000 - lVar13) - (ulong)(uVar22 != 0);
        lVar12 = lVar27 - lVar21;
        bVar30 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar27) != SBORROW8(lVar11,uVar6)) ==
                 (long)(lVar11 - uVar6) < 0;
        if (lVar13 < 0) {
          bVar30 = (SBORROW8(lVar27,lVar21) != SBORROW8(lVar12,(ulong)(uVar20 < -uVar22))) ==
                   (long)(lVar12 - (ulong)(uVar20 < -uVar22)) < 0;
        }
        if (!bVar30) goto LAB_001431bb;
        lVar21 = lVar14 + lVar17 + (ulong)CARRY8(uVar7,uVar19);
        lVar11 = lVar13 + lVar27 + (ulong)CARRY8(uVar22,uVar20);
        uVar6 = lVar21 * 4 | uVar7 + uVar19 >> 0x3e;
        psVar9->v[(long)((long)a_02[-1].v + 0x27)] = uVar7 + uVar19 & 0x3fffffffffffffff;
        uVar8 = lVar11 * 4 | uVar22 + uVar20 >> 0x3e;
        extraout_RDX_00[(long)((long)a_02[-1].v + 0x27)] = uVar22 + uVar20 & 0x3fffffffffffffff;
        a_02 = (secp256k1_modinv64_signed62 *)((long)a_02->v + 1);
        lVar11 = lVar11 >> 0x3e;
        lVar21 = lVar21 >> 0x3e;
      } while (psVar15 != a_02);
    }
    if (lVar21 + -1 + (ulong)(0x7fffffffffffffff < uVar6) != -1) goto LAB_001431d9;
    psVar9->v[(long)iVar2 + -1] = uVar6;
    if (lVar11 + -1 + (ulong)(0x7fffffffffffffff < uVar8) == -1) {
      extraout_RDX_00[(long)iVar2 + -1] = uVar8;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar25 = a_02->v[0];
  lVar10 = a_02->v[1];
  lVar11 = a_02->v[2];
  lVar12 = a_02->v[3];
  lVar24 = a_02->v[4];
  lVar28 = 0;
  do {
    if (a_02->v[lVar28] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014340f:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00143414;
    }
    if (0x3fffffffffffffff < a_02->v[lVar28]) goto LAB_0014340f;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 5);
  iVar2 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,-2);
  if (iVar2 < 1) {
LAB_00143414:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00143419:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014341e:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar2 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,1);
    if (-1 < iVar2) goto LAB_00143419;
    uVar6 = lVar24 >> 0x3f;
    uVar19 = (long)psVar9 >> 0x3f;
    uVar7 = ((uVar6 & b->v[0]) + lVar25 ^ uVar19) - uVar19;
    uVar22 = ((long)uVar7 >> 0x3e) + (((uVar6 & b->v[1]) + lVar10 ^ uVar19) - uVar19);
    uVar20 = ((long)uVar22 >> 0x3e) + ((lVar11 + (uVar6 & b->v[2]) ^ uVar19) - uVar19);
    uVar8 = ((long)uVar20 >> 0x3e) + (((uVar6 & b->v[3]) + lVar12 ^ uVar19) - uVar19);
    lVar25 = ((long)uVar8 >> 0x3e) + (((uVar6 & b->v[4]) + lVar24 ^ uVar19) - uVar19);
    uVar19 = lVar25 >> 0x3f;
    uVar6 = (b->v[0] & uVar19) + (uVar7 & 0x3fffffffffffffff);
    uVar22 = ((long)uVar6 >> 0x3e) + (b->v[1] & uVar19) + (uVar22 & 0x3fffffffffffffff);
    uVar7 = ((long)uVar22 >> 0x3e) + (b->v[2] & uVar19) + (uVar20 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar7 >> 0x3e) + (b->v[3] & uVar19) + (uVar8 & 0x3fffffffffffffff);
    uVar19 = (b->v[4] & uVar19) + lVar25 + ((long)uVar8 >> 0x3e);
    a_02->v[0] = uVar6 & 0x3fffffffffffffff;
    a_02->v[1] = uVar22 & 0x3fffffffffffffff;
    a_02->v[2] = uVar7 & 0x3fffffffffffffff;
    a_02->v[3] = uVar8 & 0x3fffffffffffffff;
    a_02->v[4] = uVar19;
    if (0x3fffffffffffffff < uVar19) goto LAB_0014341e;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,0);
    if (-1 < iVar2) {
      iVar2 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_00143428;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00143428:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_from_signed62(secp256k1_scalar *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->d[0] = a0      | a1 << 62;
    r->d[1] = a1 >> 2 | a2 << 60;
    r->d[2] = a2 >> 4 | a3 << 58;
    r->d[3] = a3 >> 6 | a4 << 56;

    SECP256K1_SCALAR_VERIFY(r);
}